

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# av1_cx_iface.c
# Opt level: O0

aom_codec_err_t ctrl_set_fp_mt(aom_codec_alg_priv_t_conflict *ctx,__va_list_tag *args)

{
  aom_codec_err_t aVar1;
  aom_codec_err_t aVar2;
  av1_extracfg *in_RSI;
  long in_RDI;
  int res;
  int i;
  int num_fp_contexts;
  aom_codec_err_t result;
  av1_extracfg extra_cfg;
  int in_stack_fffffffffffffd78;
  uint uVar3;
  undefined4 in_stack_fffffffffffffd80;
  int iVar4;
  int iVar5;
  AV1_COMP **in_stack_fffffffffffffd90;
  AV1_PRIMARY *in_stack_fffffffffffffd98;
  AV1EncoderConfig *in_stack_fffffffffffffdb0;
  AV1_PRIMARY *in_stack_fffffffffffffdb8;
  
  memcpy(&stack0xfffffffffffffd90,(void *)(in_RDI + 0x458),600);
  uVar3 = in_RSI->cpu_used;
  if (uVar3 < 0x29) {
    in_RSI->cpu_used = uVar3 + 8;
  }
  else {
    *(long *)&in_RSI->enable_auto_bwd_ref = *(long *)&in_RSI->enable_auto_bwd_ref + 8;
  }
  aVar1 = update_extra_cfg((aom_codec_alg_priv_t_conflict *)
                           CONCAT44(uVar3,in_stack_fffffffffffffd78),in_RSI);
  iVar5 = 1;
  if ((*(int *)(*(long *)(in_RDI + 0xb50) + 0x148) == 1) &&
     (iVar5 = av1_compute_num_fp_contexts(in_stack_fffffffffffffdb8,in_stack_fffffffffffffdb0),
     1 < iVar5)) {
    for (iVar4 = 1; iVar4 < iVar5; iVar4 = iVar4 + 1) {
      aVar2 = av1_create_context_and_bufferpool
                        (in_stack_fffffffffffffd98,in_stack_fffffffffffffd90,
                         (BufferPool **)CONCAT44(aVar1,iVar5),
                         (AV1EncoderConfig *)CONCAT44(iVar4,in_stack_fffffffffffffd80),
                         (COMPRESSOR_STAGE)(uVar3 >> 0x18),in_stack_fffffffffffffd78);
      if (aVar2 != AOM_CODEC_OK) {
        return aVar2;
      }
      *(undefined8 *)(*(long *)(*(long *)(in_RDI + 0xb50) + (long)iVar4 * 8) + 0x9d618) =
           **(undefined8 **)(*(long *)(in_RDI + 0xb50) + 0x5d58);
      in_stack_fffffffffffffd80 = 0;
    }
  }
  *(int *)(*(long *)(in_RDI + 0xb50) + 0x148) = iVar5;
  return aVar1;
}

Assistant:

static aom_codec_err_t ctrl_set_fp_mt(aom_codec_alg_priv_t *ctx, va_list args) {
  struct av1_extracfg extra_cfg = ctx->extra_cfg;
  extra_cfg.fp_mt = CAST(AV1E_SET_FP_MT, args);
  const aom_codec_err_t result = update_extra_cfg(ctx, &extra_cfg);
  int num_fp_contexts = 1;
  if (ctx->ppi->num_fp_contexts == 1) {
    num_fp_contexts =
        av1_compute_num_fp_contexts(ctx->ppi, &ctx->ppi->parallel_cpi[0]->oxcf);
    if (num_fp_contexts > 1) {
      int i;
      for (i = 1; i < num_fp_contexts; i++) {
        int res = av1_create_context_and_bufferpool(
            ctx->ppi, &ctx->ppi->parallel_cpi[i], &ctx->buffer_pool, &ctx->oxcf,
            ENCODE_STAGE, -1);
        if (res != AOM_CODEC_OK) {
          return res;
        }
#if !CONFIG_REALTIME_ONLY
        ctx->ppi->parallel_cpi[i]->twopass_frame.stats_in =
            ctx->ppi->twopass.stats_buf_ctx->stats_in_start;
#endif
      }
    }
  }
  ctx->ppi->num_fp_contexts = num_fp_contexts;
  return result;
}